

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::setOptionValue(Highs *this,string *option,char *value)

{
  HighsLogOptions *log_options;
  OptionStatus OVar1;
  HighsStatus HVar2;
  HighsLogOptions report_log_options;
  
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  HighsLogOptions::HighsLogOptions(&report_log_options,log_options);
  OVar1 = setLocalOptionValue(&report_log_options,option,log_options,&(this->options_).records,value
                             );
  if (OVar1 == kOk) {
    HVar2 = optionChangeAction(this);
  }
  else {
    HVar2 = kError;
  }
  std::_Function_base::~_Function_base(&report_log_options.user_callback.super__Function_base);
  return HVar2;
}

Assistant:

HighsStatus Highs::setOptionValue(const std::string& option,
                                  const char* value) {
  HighsLogOptions report_log_options = options_.log_options;
  if (setLocalOptionValue(report_log_options, option, options_.log_options,
                          options_.records, value) == OptionStatus::kOk)
    return optionChangeAction();
  return HighsStatus::kError;
}